

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

SegmentAnd<capnp::word_*>
capnp::_::WireHelpers::setListPointer
          (SegmentBuilder *segment,CapTableBuilder *capTable,WirePointer *ref,ListReader value,
          BuilderArena *orphanArena,bool canonical)

{
  char *pcVar1;
  word *pwVar2;
  ListElementCount LVar3;
  int iVar4;
  ulong uVar5;
  word *pwVar6;
  uint uVar7;
  uint uVar8;
  void *pvVar9;
  WirePointer *pWVar10;
  long lVar11;
  BuilderArena *this;
  byte *pbVar12;
  ulong unaff_RBP;
  uint i;
  ElementCount index;
  SegmentWordCount amount;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  SegmentBuilder *dstSegment;
  byte *__src;
  WirePointer *unaff_R15;
  long lVar16;
  bool bVar17;
  AllocateResult AVar18;
  AllocateResult AVar19;
  SegmentAnd<capnp::word_*> SVar20;
  long local_100;
  unsigned_long totalSize;
  WirePointer *local_e8;
  WirePointer *local_e0;
  WirePointer *local_d8;
  byte *local_d0;
  size_t local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  Fault f;
  StructReader element;
  unsigned_long newTotalSize;
  
  LVar3 = value.elementCount;
  uVar15 = 0x7ffffff80;
  this = (BuilderArena *)(ulong)value.elementCount;
  uVar13 = (ulong)value.step * (long)this;
  if (uVar13 < 0x7ffffff81) {
    AVar18.words = (word *)ref;
    AVar18.segment = segment;
    uVar13 = uVar13 + 0x3f >> 6;
    totalSize = uVar13;
    if (value.elementSize != INLINE_COMPOSITE) {
      if (orphanArena == (BuilderArena *)0x0) {
        orphanArena = (BuilderArena *)segment;
        if ((ref->field_1).upper32Bits != 0 || (ref->offsetAndKind).value != 0) {
          zeroObject(segment,capTable,ref);
        }
        pWVar10 = (WirePointer *)segment->pos;
        if ((long)((long)(segment->super_SegmentReader).ptr.ptr +
                  ((segment->super_SegmentReader).ptr.size_ * 8 - (long)pWVar10)) >> 3 <
            (long)uVar13) {
          pWVar10 = (WirePointer *)0x0;
        }
        else {
          segment->pos = (word *)(pWVar10 + uVar13);
        }
        if (pWVar10 == (WirePointer *)0x0) {
          orphanArena = (BuilderArena *)(segment->super_SegmentReader).arena;
          AVar18 = BuilderArena::allocate(orphanArena,(SegmentWordCount)uVar13 + 1);
          (ref->offsetAndKind).value =
               (int)AVar18.words - *(int *)&((AVar18.segment)->super_SegmentReader).ptr.ptr &
               0xfffffff8U | 2;
          ref->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)
                         ((AVar18.segment)->super_SegmentReader).id.value;
          *(undefined4 *)&(AVar18.words)->content = 1;
          pWVar10 = (WirePointer *)(AVar18.words + 1);
        }
        else {
          (ref->offsetAndKind).value =
               ((uint)((ulong)((long)pWVar10 - (long)ref) >> 1) & 0xfffffffc) - 3;
        }
      }
      else {
        AVar19 = BuilderArena::allocate(orphanArena,(SegmentWordCount)uVar13);
        pWVar10 = (WirePointer *)AVar19.words;
        AVar18.segment = AVar19.segment;
        (ref->offsetAndKind).value = 0xfffffffd;
      }
      ref = (WirePointer *)AVar18.words;
      dstSegment = AVar18.segment;
      this = (BuilderArena *)(ulong)value.elementCount;
      local_e8 = pWVar10;
      if (value.elementSize == 6) {
        (ref->field_1).upper32Bits = value.elementCount * 8 | 6;
        if (this != (BuilderArena *)0x0) {
          lVar16 = 8;
          lVar14 = -8;
          do {
            lVar11 = (long)(*(int *)(value.ptr + lVar16 + -8) >> 2);
            if (value.segment == (SegmentReader *)0x0) {
              pwVar6 = (word *)(value.ptr + lVar16 + lVar11 * 8);
            }
            else {
              pwVar2 = ((value.segment)->ptr).ptr;
              pwVar6 = pwVar2 + ((value.segment)->ptr).size_;
              if (((long)pwVar2 + (lVar14 - (long)value.ptr) >> 3 <= lVar11) &&
                 (lVar11 <= (long)pwVar6 + (lVar14 - (long)value.ptr) >> 3)) {
                pwVar6 = (word *)(value.ptr + lVar16 + lVar11 * 8);
              }
            }
            copyPointer(dstSegment,capTable,pWVar10,value.segment,value.capTable,
                        (WirePointer *)(value.ptr + lVar16 + -8),pwVar6,value.nestingLimit,
                        (BuilderArena *)0x0,canonical);
            pWVar10 = pWVar10 + 1;
            lVar16 = lVar16 + 8;
            lVar11 = (long)this * 8 + lVar14;
            lVar14 = lVar14 + -8;
          } while (lVar11 != 0);
        }
        goto LAB_0011ed03;
      }
      (ref->field_1).upper32Bits = value.elementCount * 8 | (uint)value.elementSize;
      uVar5 = (ulong)value.step * (long)this;
      uVar15 = 0x7ffffffc7;
      if (uVar5 < 0x7ffffffc8) {
        uVar15 = uVar5 >> 3;
        if (7 < uVar5) {
          memcpy(pWVar10,value.ptr,uVar15);
        }
        uVar8 = value.step * value.elementCount & 7;
        if (uVar8 != 0) {
          *(byte *)((long)&(pWVar10->offsetAndKind).value + uVar15) =
               ~(-1 << (sbyte)uVar8) & value.ptr[uVar15];
        }
        goto LAB_0011ed03;
      }
      goto LAB_0011ed1d;
    }
    local_d0 = (byte *)(ulong)(value.structDataSize >> 6);
    local_d8 = (WirePointer *)CONCAT62(local_d8._2_6_,value.structPointerCount);
    if (canonical) {
      unaff_RBP = 0;
      if (value.elementCount == 0) {
        uVar15 = 0;
      }
      else {
        uVar13 = 0;
        index = 0;
        uVar15 = unaff_RBP;
        local_e0 = ref;
        do {
          ListReader::getStructElement(&element,&value,index);
          pvVar9 = (void *)((ulong)(element.dataSize >> 3) + (long)element.data);
          uVar8 = (element.dataSize >> 3) + 7;
          do {
            uVar7 = uVar8;
            if (pvVar9 <= element.data) break;
            pcVar1 = (char *)((long)pvVar9 - 1);
            pvVar9 = (void *)((long)pvVar9 - 1);
            uVar8 = uVar7 - 1;
          } while (*pcVar1 == '\0');
          uVar7 = uVar7 >> 3;
          uVar5 = uVar15 & 0xffff;
          uVar15 = (ulong)uVar7;
          if (uVar7 <= (uint)uVar5) {
            uVar15 = uVar5;
          }
          lVar14 = (ulong)element.pointerCount << 3;
          do {
            lVar16 = lVar14;
            pWVar10 = (WirePointer *)((long)&((element.pointers)->offsetAndKind).value + lVar16);
            if (pWVar10 <= element.pointers) break;
            lVar14 = lVar16 + -8;
          } while (pWVar10[-1].field_1.upper32Bits == 0 && pWVar10[-1].offsetAndKind.value == 0);
          uVar5 = uVar13 & 0xffff;
          uVar13 = lVar16 >> 3;
          if (lVar16 >> 3 <= (long)uVar5) {
            uVar13 = uVar5;
          }
          index = index + 1;
        } while (index != LVar3);
        unaff_RBP = uVar13 & 0xffffffff;
        ref = local_e0;
      }
      newTotalSize = (ulong)value.elementCount * ((unaff_RBP & 0xffff) + (uVar15 & 0xffff));
      element.segment = (SegmentReader *)&newTotalSize;
      element.capTable = (CapTableReader *)&totalSize;
      element.data = anon_var_dwarf_59a07;
      element.pointers = (WirePointer *)0x5;
      bVar17 = newTotalSize - totalSize == 0;
      element.dataSize = CONCAT31(element.dataSize._1_3_,newTotalSize < totalSize || bVar17);
      uVar13 = newTotalSize;
      if (newTotalSize >= totalSize && !bVar17) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x772,FAILED,"newTotalSize <= totalSize","_kjCondition,",
                   (DebugComparison<unsigned_long_&,_unsigned_long_&> *)&element);
        kj::_::Debug::Fault::fatal(&f);
      }
    }
    else {
      unaff_RBP = (ulong)value.structPointerCount;
      uVar15 = (ulong)(value.structDataSize >> 6);
    }
    totalSize = uVar13;
    AVar19.words = (word *)ref;
    AVar19.segment = segment;
    iVar4 = (int)totalSize;
    uVar8 = (int)totalSize + 1;
    if (orphanArena == (BuilderArena *)0x0) {
      if ((ref->field_1).upper32Bits != 0 || (ref->offsetAndKind).value != 0) {
        zeroObject(segment,capTable,ref);
      }
      local_e8 = (WirePointer *)segment->pos;
      if ((long)((long)(segment->super_SegmentReader).ptr.ptr +
                ((segment->super_SegmentReader).ptr.size_ * 8 - (long)local_e8)) >> 3 <
          (long)(ulong)uVar8) {
        local_e8 = (WirePointer *)0x0;
      }
      else {
        segment->pos = (word *)(local_e8 + uVar8);
      }
      if (local_e8 != (WirePointer *)0x0) {
        (ref->offsetAndKind).value =
             ((uint)((ulong)((long)local_e8 - (long)ref) >> 1) & 0xfffffffc) - 3;
        goto LAB_0011eaff;
      }
      amount = iVar4 + 2;
      this = (BuilderArena *)(segment->super_SegmentReader).arena;
      if (0x1fffffff < amount) goto LAB_0011ed22;
      goto LAB_0011eac1;
    }
    AVar18 = BuilderArena::allocate(orphanArena,uVar8);
    local_e8 = (WirePointer *)AVar18.words;
    AVar19.segment = AVar18.segment;
    (ref->offsetAndKind).value = 0xfffffffd;
  }
  else {
    setListPointer::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)segment);
    orphanArena = (BuilderArena *)segment;
    ref = unaff_R15;
LAB_0011ed1d:
    amount = (SegmentWordCount)uVar13;
    setListPointer::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)orphanArena);
LAB_0011ed22:
    allocate::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&element);
LAB_0011eac1:
    AVar19 = BuilderArena::allocate(this,amount);
    (ref->offsetAndKind).value =
         (int)AVar19.words - *(int *)&((AVar19.segment)->super_SegmentReader).ptr.ptr & 0xfffffff8U
         | 2;
    ref->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)
                   ((AVar19.segment)->super_SegmentReader).id.value;
    *(undefined4 *)&(AVar19.words)->content = 1;
    local_e8 = (WirePointer *)(AVar19.words + 1);
  }
LAB_0011eaff:
  dstSegment = AVar19.segment;
  *(int *)((long)&(AVar19.words)->content + 4) = (int)totalSize * 8 + 7;
  local_78 = (ulong)value.elementCount;
  (local_e8->offsetAndKind).value = value.elementCount * 4;
  (local_e8->field_1).structRef.dataSize.value = (unsigned_short)uVar15;
  (local_e8->field_1).structRef.ptrCount.value = (unsigned_short)unaff_RBP;
  if (value.elementCount != 0) {
    local_90 = (ulong)local_d8 & 0xffff;
    pWVar10 = local_e8 + 1;
    local_98 = uVar15 & 0xffff;
    local_c8 = (size_t)(uint)((int)local_98 << 3);
    local_a0 = (ulong)local_d0 & 0xffff;
    local_a8 = unaff_RBP & 0xffff;
    lVar14 = (long)&local_e8[1].offsetAndKind.value + local_c8;
    uVar13 = (ulong)(uint)((int)local_a8 << 3);
    local_b0 = local_c8 + uVar13;
    pbVar12 = value.ptr + (uint)(ushort)local_d0 * 8;
    local_b8 = (ulong)((uint)(ushort)local_d0 * 8) + local_90 * 8;
    local_100 = -8 - (long)pbVar12;
    local_c0 = -local_b8;
    local_e0 = (WirePointer *)0x0;
    __src = value.ptr;
    local_88 = uVar15;
    local_80 = unaff_RBP;
    do {
      if ((short)local_88 != 0) {
        memcpy(pWVar10,__src,local_c8);
      }
      local_d8 = pWVar10;
      local_d0 = __src;
      if ((short)local_80 != 0) {
        uVar15 = 0;
        lVar16 = local_100;
        do {
          lVar11 = (long)(*(int *)(pbVar12 + uVar15) >> 2);
          if (value.segment == (SegmentReader *)0x0) {
            pwVar6 = (word *)(pbVar12 + uVar15 + lVar11 * 8 + 8);
          }
          else {
            pwVar2 = ((value.segment)->ptr).ptr;
            pwVar6 = pwVar2 + ((value.segment)->ptr).size_;
            if (((long)&pwVar2->content + lVar16 >> 3 <= lVar11) &&
               (lVar11 <= (long)&pwVar6->content + lVar16 >> 3)) {
              pwVar6 = (word *)(pbVar12 + uVar15 + lVar11 * 8 + 8);
            }
          }
          copyPointer(dstSegment,capTable,(WirePointer *)(lVar14 + uVar15),value.segment,
                      value.capTable,(WirePointer *)(pbVar12 + uVar15),pwVar6,value.nestingLimit,
                      (BuilderArena *)0x0,canonical);
          uVar15 = uVar15 + 8;
          lVar16 = lVar16 + -8;
        } while (uVar13 != uVar15);
      }
      pWVar10 = local_d8 + local_98 + local_a8;
      __src = local_d0 + local_90 * 8 + local_a0 * 8;
      uVar8 = (int)local_e0 + 1;
      local_e0 = (WirePointer *)(ulong)uVar8;
      lVar14 = lVar14 + local_b0;
      pbVar12 = pbVar12 + local_b8;
      local_100 = local_100 + local_c0;
    } while (uVar8 != (uint)local_78);
  }
LAB_0011ed03:
  SVar20.value = (word *)local_e8;
  SVar20.segment = dstSegment;
  return SVar20;
}

Assistant:

static SegmentAnd<word*> setListPointer(
      SegmentBuilder* segment, CapTableBuilder* capTable, WirePointer* ref, ListReader value,
      BuilderArena* orphanArena = nullptr, bool canonical = false) {
    auto totalSize = assertMax<kj::maxValueForBits<SEGMENT_WORD_COUNT_BITS>() - 1>(
        roundBitsUpToWords(upgradeBound<uint64_t>(value.elementCount) * value.step),
        []() { KJ_FAIL_ASSERT("encountered impossibly long struct list ListReader"); });

    if (value.elementSize != ElementSize::INLINE_COMPOSITE) {
      // List of non-structs.
      word* ptr = allocate(ref, segment, capTable, totalSize, WirePointer::LIST, orphanArena);

      if (value.elementSize == ElementSize::POINTER) {
        // List of pointers.
        ref->listRef.set(ElementSize::POINTER, value.elementCount);
        for (auto i: kj::zeroTo(value.elementCount * (ONE * POINTERS / ELEMENTS))) {
          copyPointer(segment, capTable, reinterpret_cast<WirePointer*>(ptr) + i,
                      value.segment, value.capTable,
                      reinterpret_cast<const WirePointer*>(value.ptr) + i,
                      value.nestingLimit, nullptr, canonical);
        }
      } else {
        // List of data.
        ref->listRef.set(value.elementSize, value.elementCount);

        auto wholeByteSize =
          assertMax(MAX_SEGMENT_WORDS * BYTES_PER_WORD,
            upgradeBound<uint64_t>(value.elementCount) * value.step / BITS_PER_BYTE,
            []() { KJ_FAIL_ASSERT("encountered impossibly long data ListReader"); });
        copyMemory(reinterpret_cast<byte*>(ptr), value.ptr, wholeByteSize);
        auto leftoverBits =
          (upgradeBound<uint64_t>(value.elementCount) * value.step) % BITS_PER_BYTE;
        if (leftoverBits > ZERO * BITS) {
          // We need to copy a partial byte.
          uint8_t mask = (1 << unbound(leftoverBits / BITS)) - 1;
          *((reinterpret_cast<byte*>(ptr)) + wholeByteSize) = mask & *(value.ptr + wholeByteSize);
        }
      }

      return { segment, ptr };
    } else {
      // List of structs.
      StructDataWordCount declDataSize = value.structDataSize / BITS_PER_WORD;
      StructPointerCount declPointerCount = value.structPointerCount;

      StructDataWordCount dataSize = ZERO * WORDS;
      StructPointerCount ptrCount = ZERO * POINTERS;

      if (canonical) {
        for (auto i: kj::zeroTo(value.elementCount)) {
          auto element = value.getStructElement(i);

          // Truncate the data section
          auto data = element.getDataSectionAsBlob();
          auto end = data.end();
          while (end > data.begin() && end[-1] == 0) --end;
          dataSize = kj::max(dataSize, roundBytesUpToWords(
              intervalLength(data.begin(), end, MAX_STRUCT_DATA_WORDS * BYTES_PER_WORD)));

          // Truncate pointer section
          const WirePointer* ptr = element.pointers + element.pointerCount;
          while (ptr > element.pointers && ptr[-1].isNull()) --ptr;
          ptrCount = kj::max(ptrCount,
              intervalLength(element.pointers, ptr, MAX_STRUCT_POINTER_COUNT));
        }
        auto newTotalSize = (dataSize + upgradeBound<uint64_t>(ptrCount) * WORDS_PER_POINTER)
            / ELEMENTS * value.elementCount;
        KJ_ASSERT(newTotalSize <= totalSize);  // we've only removed data!
        totalSize = assumeMax<kj::maxValueForBits<SEGMENT_WORD_COUNT_BITS>() - 1>(newTotalSize);
      } else {
        dataSize = declDataSize;
        ptrCount = declPointerCount;
      }

      KJ_DASSERT(value.structDataSize % BITS_PER_WORD == ZERO * BITS);
      word* ptr = allocate(ref, segment, capTable, totalSize + POINTER_SIZE_IN_WORDS,
                           WirePointer::LIST, orphanArena);
      ref->listRef.setInlineComposite(totalSize);

      WirePointer* tag = reinterpret_cast<WirePointer*>(ptr);
      tag->setKindAndInlineCompositeListElementCount(WirePointer::STRUCT, value.elementCount);
      tag->structRef.set(dataSize, ptrCount);
      word* dst = ptr + POINTER_SIZE_IN_WORDS;

      const word* src = reinterpret_cast<const word*>(value.ptr);
      for (auto i KJ_UNUSED: kj::zeroTo(value.elementCount)) {
        copyMemory(dst, src, dataSize);
        dst += dataSize;
        src += declDataSize;

        for (auto j: kj::zeroTo(ptrCount)) {
          copyPointer(segment, capTable, reinterpret_cast<WirePointer*>(dst) + j,
              value.segment, value.capTable, reinterpret_cast<const WirePointer*>(src) + j,
              value.nestingLimit, nullptr, canonical);
        }
        dst += ptrCount * WORDS_PER_POINTER;
        src += declPointerCount * WORDS_PER_POINTER;
      }

      return { segment, ptr };
    }
  }